

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_attr2(lyd_node *parent,char *module_ns,char *name,char *value,lyd_attr **attr)

{
  ly_ctx *ctx;
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  size_t value_len;
  char *pcVar4;
  char *name_local;
  char *local_78;
  size_t name_len;
  size_t pref_len;
  char *prefix;
  size_t local_58;
  lyd_attr *ret;
  char *local_48;
  size_t local_40;
  char *tmp;
  
  ret = (lyd_attr *)0x0;
  name_local = name;
  if (parent == (lyd_node *)0x0) {
    pcVar4 = "parent";
  }
  else if (parent->schema == (lysc_node *)0x0) {
    if (name != (char *)0x0) {
      ctx = (ly_ctx *)parent[2].schema;
      tmp = name;
      LVar1 = ly_parse_nodeid(&tmp,&prefix,&pref_len,&name_local,&name_len);
      if ((LVar1 != LY_SUCCESS) || (*tmp != '\0')) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Attribute name \"%s\" is not valid.",name_local);
        return LY_EVALID;
      }
      if (pref_len == 3) {
        local_78 = prefix;
        iVar2 = strncmp(prefix,"xml",3);
        if (iVar2 == 0) {
          name_local = local_78;
          name_len = name_len + 4;
          prefix = (char *)0x0;
          pref_len = 0;
        }
      }
      pcVar4 = "";
      if (value != (char *)0x0) {
        pcVar4 = value;
      }
      pcVar3 = strchr(pcVar4,0x3a);
      if (pcVar3 != (char *)0x0) {
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,
               "Value \"%s\" prefix will never be interpreted as an XML prefix.",pcVar4);
      }
      pcVar3 = name_local;
      local_40 = name_len;
      local_48 = prefix;
      local_78 = (char *)pref_len;
      if (module_ns == (char *)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = strlen(module_ns);
      }
      value_len = strlen(pcVar4);
      LVar1 = lyd_create_attr(parent,&ret,ctx,pcVar3,local_40,local_48,(size_t)local_78,module_ns,
                              local_58,pcVar4,value_len,(ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,
                              0x3f3);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (attr != (lyd_attr **)0x0) {
        *attr = ret;
      }
      return LY_SUCCESS;
    }
    pcVar4 = "name";
  }
  else {
    pcVar4 = "!parent->schema";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"lyd_new_attr2");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_attr2(struct lyd_node *parent, const char *module_ns, const char *name, const char *value,
        struct lyd_attr **attr)
{
    struct lyd_attr *ret = NULL;
    const struct ly_ctx *ctx;
    const char *prefix, *tmp;
    size_t pref_len, name_len;

    LY_CHECK_ARG_RET(NULL, parent, !parent->schema, name, LY_EINVAL);

    ctx = LYD_CTX(parent);

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Attribute name \"%s\" is not valid.", name);
        return LY_EVALID;
    }

    if ((pref_len == 3) && !strncmp(prefix, "xml", 3)) {
        /* not a prefix but special name */
        name = prefix;
        name_len += 1 + pref_len;
        prefix = NULL;
        pref_len = 0;
    }

    /* set value if none */
    if (!value) {
        value = "";
    }
    if (strchr(value, ':')) {
        LOGWRN(ctx, "Value \"%s\" prefix will never be interpreted as an XML prefix.", value);
    }

    LY_CHECK_RET(lyd_create_attr(parent, &ret, ctx, name, name_len, prefix, pref_len, module_ns,
            module_ns ? strlen(module_ns) : 0, value, strlen(value), NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA));

    if (attr) {
        *attr = ret;
    }
    return LY_SUCCESS;
}